

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

void analyze_hor_freq(AV1_COMP *cpi,double *energy)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  undefined1 auVar2 [16];
  int k_4;
  int k_3;
  int k_2;
  uint64_t this_energy_1;
  int k_1;
  int jj;
  int ii;
  int j_1;
  int i_1;
  int16_t src16_1 [64];
  uint64_t this_energy;
  int k;
  int j;
  int i;
  int16_t *src16;
  int n;
  int32_t coeff [64];
  int height;
  int width;
  int bd;
  YV12_BUFFER_CONFIG *buf;
  uint64_t freq_energy [16];
  int local_294;
  int local_290;
  int local_28c;
  int local_27c;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  ushort local_268 [68];
  long local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long local_1c8;
  int local_1bc;
  int32_t local_1b8;
  int local_1b4 [16];
  int aiStack_174 [16];
  int aiStack_134 [16];
  int aiStack_f4 [18];
  int local_ac;
  int local_a8;
  int local_a4;
  long local_a0;
  long local_98 [17];
  long local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_98,0,0x80);
  local_a0 = *(long *)(local_8 + 0x427a8);
  local_a4 = *(int *)(local_8 + 0x17b70);
  local_a8 = *(int *)(local_a0 + 0x10);
  local_ac = *(int *)(local_a0 + 0x18);
  local_1bc = 0;
  memset(local_98,0,0x80);
  if ((*(uint *)(local_a0 + 0xc0) & 8) == 0) {
    for (local_26c = 0; local_26c < local_ac + -4; local_26c = local_26c + 4) {
      for (local_270 = 0; local_270 < local_a8 + -0x10; local_270 = local_270 + 0x10) {
        for (local_274 = 0; local_274 < 4; local_274 = local_274 + 1) {
          for (local_278 = 0; local_278 < 0x10; local_278 = local_278 + 1) {
            local_268[local_274 * 0x10 + local_278] =
                 (ushort)*(byte *)(*(long *)(local_a0 + 0x28) +
                                  (long)((local_26c + local_274) * *(int *)(local_a0 + 0x20) +
                                        local_270 + local_278));
          }
        }
        (*av1_fwd_txfm2d_16x4)((int16_t *)local_268,&local_1b8,0x10,'\v',local_a4);
        for (local_27c = 1; local_27c < 0x10; local_27c = local_27c + 1) {
          local_98[local_27c] =
               ((long)(&local_1b8)[local_27c] * (long)(&local_1b8)[local_27c] +
                (long)(&local_1b8)[local_27c + 0x10] * (long)(&local_1b8)[local_27c + 0x10] +
                (long)(&local_1b8)[local_27c + 0x20] * (long)(&local_1b8)[local_27c + 0x20] +
                (long)(&local_1b8)[local_27c + 0x30] * (long)(&local_1b8)[local_27c + 0x30] + 2U >>
               2) + local_98[local_27c];
        }
        local_1bc = local_1bc + 1;
      }
    }
  }
  else {
    local_1c8 = *(long *)(local_a0 + 0x28) << 1;
    for (local_1cc = 0; local_1cc < local_ac + -4; local_1cc = local_1cc + 4) {
      for (local_1d0 = 0; local_1d0 < local_a8 + -0x10; local_1d0 = local_1d0 + 0x10) {
        (*av1_fwd_txfm2d_16x4)
                  ((int16_t *)
                   (local_1c8 + (long)(local_1cc * *(int *)(local_a0 + 0x20)) * 2 +
                   (long)local_1d0 * 2),&local_1b8,*(int *)(local_a0 + 0x20),'\v',local_a4);
        for (local_1d4 = 1; local_1d4 < 0x10; local_1d4 = local_1d4 + 1) {
          local_1e0 = (long)(&local_1b8)[local_1d4] * (long)(&local_1b8)[local_1d4] +
                      (long)(&local_1b8)[local_1d4 + 0x10] * (long)(&local_1b8)[local_1d4 + 0x10] +
                      (long)(&local_1b8)[local_1d4 + 0x20] * (long)(&local_1b8)[local_1d4 + 0x20] +
                      (long)(&local_1b8)[local_1d4 + 0x30] * (long)(&local_1b8)[local_1d4 + 0x30];
          local_98[local_1d4] =
               ((ulong)(local_1e0 + ((1 << (((char)local_a4 + -8) * '\x02' + 2U & 0x1f)) >> 1)) >>
               (((char)local_a4 + -8) * '\x02' + 2U & 0x3f)) + local_98[local_1d4];
        }
        local_1bc = local_1bc + 1;
      }
    }
  }
  if (local_1bc == 0) {
    for (local_294 = 1; local_294 < 0x10; local_294 = local_294 + 1) {
      *(undefined8 *)(local_10 + (long)local_294 * 8) = 0x4415af1d78b58c40;
    }
  }
  else {
    for (local_28c = 1; local_28c < 0x10; local_28c = local_28c + 1) {
      lVar1 = local_98[local_28c];
      auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar2._0_8_ = lVar1;
      auVar2._12_4_ = 0x45300000;
      *(double *)(local_10 + (long)local_28c * 8) =
           ((auVar2._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / (double)local_1bc;
    }
    for (local_290 = 0xe; 0 < local_290; local_290 = local_290 + -1) {
      *(double *)(local_10 + (long)local_290 * 8) =
           *(double *)(local_10 + (long)(local_290 + 1) * 8) +
           *(double *)(local_10 + (long)local_290 * 8);
    }
  }
  return;
}

Assistant:

static void analyze_hor_freq(const AV1_COMP *cpi, double *energy) {
  uint64_t freq_energy[16] = { 0 };
  const YV12_BUFFER_CONFIG *buf = cpi->source;
  const int bd = cpi->td.mb.e_mbd.bd;
  const int width = buf->y_crop_width;
  const int height = buf->y_crop_height;
  DECLARE_ALIGNED(16, int32_t, coeff[16 * 4]);
  int n = 0;
  memset(freq_energy, 0, sizeof(freq_energy));
  if (buf->flags & YV12_FLAG_HIGHBITDEPTH) {
    const int16_t *src16 = (const int16_t *)CONVERT_TO_SHORTPTR(buf->y_buffer);
    for (int i = 0; i < height - 4; i += 4) {
      for (int j = 0; j < width - 16; j += 16) {
        av1_fwd_txfm2d_16x4(src16 + i * buf->y_stride + j, coeff, buf->y_stride,
                            H_DCT, bd);
        for (int k = 1; k < 16; ++k) {
          const uint64_t this_energy =
              ((int64_t)coeff[k] * coeff[k]) +
              ((int64_t)coeff[k + 16] * coeff[k + 16]) +
              ((int64_t)coeff[k + 32] * coeff[k + 32]) +
              ((int64_t)coeff[k + 48] * coeff[k + 48]);
          freq_energy[k] += ROUND_POWER_OF_TWO(this_energy, 2 + 2 * (bd - 8));
        }
        n++;
      }
    }
  } else {
    assert(bd == 8);
    DECLARE_ALIGNED(16, int16_t, src16[16 * 4]);
    for (int i = 0; i < height - 4; i += 4) {
      for (int j = 0; j < width - 16; j += 16) {
        for (int ii = 0; ii < 4; ++ii)
          for (int jj = 0; jj < 16; ++jj)
            src16[ii * 16 + jj] =
                buf->y_buffer[(i + ii) * buf->y_stride + (j + jj)];
        av1_fwd_txfm2d_16x4(src16, coeff, 16, H_DCT, bd);
        for (int k = 1; k < 16; ++k) {
          const uint64_t this_energy =
              ((int64_t)coeff[k] * coeff[k]) +
              ((int64_t)coeff[k + 16] * coeff[k + 16]) +
              ((int64_t)coeff[k + 32] * coeff[k + 32]) +
              ((int64_t)coeff[k + 48] * coeff[k + 48]);
          freq_energy[k] += ROUND_POWER_OF_TWO(this_energy, 2);
        }
        n++;
      }
    }
  }
  if (n) {
    for (int k = 1; k < 16; ++k) energy[k] = (double)freq_energy[k] / n;
    // Convert to cumulative energy
    for (int k = 14; k > 0; --k) energy[k] += energy[k + 1];
  } else {
    for (int k = 1; k < 16; ++k) energy[k] = 1e+20;
  }
}